

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O3

void Sdm_ManDivCollect_rec(word t,Vec_Wrd_t **pvDivs)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  iVar1 = Sdm_ManCheckDsd6(s_SdmMan,t);
  if (iVar1 == -1 || 0x3ffff < iVar1) {
    lVar4 = 0;
    lVar6 = 0;
    uVar5 = 0;
    do {
      bVar3 = (byte)(1 << ((byte)lVar6 & 0x1f));
      if ((*(ulong *)((long)s_Truths6Neg + lVar4) & (t >> (bVar3 & 0x3f) ^ t)) != 0) {
        uVar2 = *(ulong *)((long)s_Truths6Neg + lVar4) & t;
        Sdm_ManDivCollect_rec(uVar2 << (bVar3 & 0x3f) | uVar2,pvDivs);
        uVar2 = *(ulong *)((long)s_Truths6 + lVar4) & t;
        Sdm_ManDivCollect_rec(uVar2 >> (bVar3 & 0x3f) | uVar2,pvDivs);
        uVar5 = uVar5 + 1;
      }
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar6 != 6);
    if (uVar5 - 2 < 3 && iVar1 != -1) {
      Vec_WrdPush(pvDivs[uVar5],-(ulong)((uint)t & 1) ^ t);
      return;
    }
  }
  return;
}

Assistant:

void Sdm_ManDivCollect_rec( word t, Vec_Wrd_t ** pvDivs )
{
    int i, Config, Counter = 0;
    // check if function is decomposable
    Config = Sdm_ManCheckDsd6( s_SdmMan, t );
    if ( Config != -1 && (Config >> 17) < 2 )
        return;
    for ( i = 0; i < 6; i++ )
    {
        if ( !Abc_Tt6HasVar( t, i ) )
            continue;
        Sdm_ManDivCollect_rec( Abc_Tt6Cofactor0(t, i), pvDivs );
        Sdm_ManDivCollect_rec( Abc_Tt6Cofactor1(t, i), pvDivs );
        Counter++;
    }
    if ( Config != -1 && Counter >= 2 && Counter <= 4 )
    {
        Vec_WrdPush( pvDivs[Counter], (t & 1) ? ~t : t );
//        Kit_DsdPrintFromTruth( (unsigned *)&t, 6 ); printf( "\n" );
    }
}